

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

bool __thiscall CDirectiveHeaderSize::Validate(CDirectiveHeaderSize *this,ValidateState *state)

{
  bool bVar1;
  int64_t iVar2;
  ValidateState *state_local;
  CDirectiveHeaderSize *this_local;
  
  iVar2 = FileManager::getVirtualAddress(g_fileManager);
  this->virtualAddress = iVar2;
  bVar1 = Expression::evaluateInteger<long>(&this->expression,&this->headerSize);
  if (bVar1) {
    exec(this);
  }
  else {
    Logger::queueError<>(FatalError,"Invalid header size");
  }
  return false;
}

Assistant:

bool CDirectiveHeaderSize::Validate(const ValidateState &state)
{
	virtualAddress = g_fileManager->getVirtualAddress();

	if (!expression.evaluateInteger(headerSize))
	{
		Logger::queueError(Logger::FatalError, "Invalid header size");
		return false;
	}

	exec();
	return false;
}